

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

Type * slang::ast::PackedUnionType::fromSyntax
                 (Compilation *comp,StructUnionTypeSyntax *syntax,ASTContext *parentContext)

{
  bool *pbVar1;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *pSVar2;
  pointer ppSVar3;
  TokenKind TVar4;
  StructUnionMemberSyntax *pSVar5;
  SyntaxNode *syntax_00;
  size_t sVar6;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  PackedUnionType *pPVar7;
  bool bVar8;
  bitwidth_t bVar9;
  bitwidth_t bVar10;
  Type *pTVar11;
  undefined7 extraout_var;
  DeclaratorSyntax *pDVar12;
  FieldSymbol *this;
  Type *this_00;
  Diagnostic *pDVar13;
  SourceLocation SVar14;
  ulong uVar15;
  pointer ppSVar16;
  ParentList *pPVar17;
  uint uVar18;
  uint uVar19;
  SourceRange SVar20;
  string_view sVar21;
  bool isTagged;
  uint local_f0;
  bool isSoft;
  bool isSigned;
  iterator __begin3;
  uint local_d0 [2];
  Scope *local_c8;
  PackedUnionType *local_c0;
  Token name;
  SourceLocation local_80;
  string_view local_78;
  ASTContext context;
  
  isSigned = (syntax->signing).kind == SignedKeyword;
  TVar4 = (syntax->taggedOrSoft).kind;
  isTagged = TVar4 == TaggedKeyword;
  isSoft = TVar4 == SoftKeyword;
  context.scope.ptr = (Scope *)parsing::Token::location(&syntax->keyword);
  local_c0 = BumpAllocator::
             emplace<slang::ast::PackedUnionType,slang::ast::Compilation&,bool_const&,bool_const&,bool_const&,slang::SourceLocation,slang::ast::ASTContext_const&>
                       (&comp->super_BumpAllocator,comp,&isSigned,&isTagged,&isSoft,
                        (SourceLocation *)&context,parentContext);
  (local_c0->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  local_c8 = &local_c0->super_Scope;
  context.flags.m_bits = (parentContext->flags).m_bits;
  context.lookupIndex = 0xffffffff;
  context.instanceOrProc = (Symbol *)0x0;
  context.firstTempVar = (TempVarSymbol *)0x0;
  context.randomizeDetails = (RandomizeDetails *)0x0;
  context.assertionInstance = (AssertionInstanceDetails *)0x0;
  ppSVar16 = (syntax->members).
             super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
  ppSVar3 = ppSVar16 +
            (syntax->members).
            super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
            _M_extent_value;
  uVar19 = 0;
  local_f0 = 0;
  context.scope.ptr = local_c8;
  do {
    pPVar7 = local_c0;
    if (ppSVar16 == ppSVar3) {
      bVar9 = (local_c0->super_IntegralType).bitWidth;
      if ((isTagged & uVar19 != 0) != 0) {
        uVar18 = 0x20;
        uVar19 = uVar19 - 1;
        if (uVar19 != 0) {
          uVar18 = 0x1f;
          if (uVar19 != 0) {
            for (; uVar19 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar18 = uVar18 ^ 0x1f;
        }
        local_c0->tagBits = 0x20 - uVar18;
        bVar9 = bVar9 + (0x20 - uVar18);
        (local_c0->super_IntegralType).bitWidth = bVar9;
      }
      if ((bVar9 == 0) || ((local_f0 & 1) != 0)) {
        pTVar11 = comp->errorType;
      }
      else {
        pTVar11 = anon_unknown.dwarf_71bee1::createPackedDims
                            (&context,(Type *)local_c0,&syntax->dimensions);
      }
      return pTVar11;
    }
    pSVar5 = *ppSVar16;
    syntax_00 = (pSVar5->super_SyntaxNode).previewNode;
    if (syntax_00 != (SyntaxNode *)0x0) {
      Scope::addMembers(local_c8,syntax_00);
    }
    pTVar11 = Compilation::getType(comp,(pSVar5->type).ptr,&context,(Type *)0x0);
    bVar8 = Type::isFourState(pTVar11);
    pbVar1 = &(pPVar7->super_IntegralType).isFourState;
    *pbVar1 = (bool)(*pbVar1 | bVar8);
    bVar8 = Type::isError(pTVar11);
    uVar18 = local_f0 & 1;
    local_f0 = (uint)CONCAT71(extraout_var,1);
    if (uVar18 == 0 && !bVar8) {
      bVar8 = Type::isIntegral(pTVar11);
      if ((bVar8) || ((isTagged == true && (bVar8 = Type::isVoid(pTVar11), bVar8)))) {
        local_f0 = 0;
      }
      else {
        __begin3 = (iterator)
                   slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(pSVar5->type).ptr);
        SVar14 = parsing::Token::location((Token *)&__begin3);
        pDVar13 = ASTContext::addDiag(&context,(DiagCode)0x1c0009,SVar14);
        ast::operator<<(pDVar13,pTVar11);
        SVar20 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(pSVar5->type).ptr);
        Diagnostic::operator<<(pDVar13,SVar20);
      }
    }
    pSVar2 = &pSVar5->declarators;
    __begin3.index = 0;
    __begin3.list = pSVar2;
    sVar6 = (pSVar5->declarators).elements._M_extent._M_extent_value;
    uVar15 = 0;
    pPVar17 = pSVar2;
    while ((pPVar17 != pSVar2 || (uVar15 != sVar6 + 1 >> 1))) {
      pDVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
                iterator_base<slang::syntax::DeclaratorSyntax_*>::dereference(&__begin3);
      name.kind = (pDVar12->name).kind;
      name._2_1_ = (pDVar12->name).field_0x2;
      name.numFlags.raw = (pDVar12->name).numFlags.raw;
      name.rawLen = (pDVar12->name).rawLen;
      name.info = (pDVar12->name).info;
      local_78 = parsing::Token::valueText(&name);
      local_80 = parsing::Token::location(&name);
      local_d0[1] = 0;
      local_d0[0] = uVar19;
      this = BumpAllocator::
             emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_int,unsigned_int>
                       (&comp->super_BumpAllocator,&local_78,&local_80,local_d0 + 1,local_d0);
      (this->super_VariableSymbol).super_ValueSymbol.declaredType.type = pTVar11;
      (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax =
           &pDVar12->super_SyntaxNode;
      syntax_01._M_ptr =
           (pSVar5->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_01._M_extent._M_extent_value =
           (pSVar5->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)this,context.scope.ptr,syntax_01);
      Scope::addMember(local_c8,(Symbol *)this);
      this_00 = Compilation::getType(comp,pTVar11,&pDVar12->dimensions,&context);
      bVar8 = Type::isUnpackedArray(this_00);
      if ((bVar8) && ((local_f0 & 1) == 0)) {
        SVar20 = parsing::Token::range(&pDVar12->name);
        pDVar13 = ASTContext::addDiag(&context,(DiagCode)0x1c0009,SVar20);
        ast::operator<<(pDVar13,this_00);
        SVar20 = slang::syntax::SyntaxNode::sourceRange
                           (&(pDVar12->dimensions).super_SyntaxListBase.super_SyntaxNode);
        pDVar13 = Diagnostic::operator<<(pDVar13,SVar20);
        local_f0 = (uint)CONCAT71((int7)((ulong)pDVar13 >> 8),1);
      }
      pPVar7 = local_c0;
      bVar9 = (local_c0->super_IntegralType).bitWidth;
      if (bVar9 == 0) {
        bVar9 = Type::getBitWidth(pTVar11);
LAB_002230df:
        (pPVar7->super_IntegralType).bitWidth = bVar9;
      }
      else {
        if ((isTagged != false) || (isSoft == true)) {
          bVar9 = Type::getBitWidth(pTVar11);
          uVar18 = (pPVar7->super_IntegralType).bitWidth;
          if (bVar9 < uVar18) {
            bVar9 = uVar18;
          }
          goto LAB_002230df;
        }
        bVar10 = Type::getBitWidth(pTVar11);
        if (((bVar9 != bVar10) && ((local_f0 & 1) == 0)) &&
           (sVar21 = parsing::Token::valueText(&name), sVar21._M_len != 0)) {
          SVar20 = parsing::Token::range(&name);
          pDVar13 = ASTContext::addDiag(&context,(DiagCode)0x1e0009,SVar20);
          sVar21 = parsing::Token::valueText(&name);
          pDVar13 = Diagnostic::operator<<(pDVar13,sVar21);
          bVar9 = Type::getBitWidth(pTVar11);
          pDVar13 = Diagnostic::operator<<<unsigned_int>(pDVar13,bVar9);
          pDVar13 = Diagnostic::operator<<<unsigned_int>
                              (pDVar13,(pPVar7->super_IntegralType).bitWidth);
          local_f0 = (uint)CONCAT71((int7)((ulong)pDVar13 >> 8),1);
        }
      }
      if (pDVar12->initializer != (EqualsValueClauseSyntax *)0x0) {
        SVar14 = parsing::Token::location(&pDVar12->initializer->equals);
        pDVar13 = ASTContext::addDiag(&context,(DiagCode)0x1b0009,SVar14);
        SVar20 = slang::syntax::SyntaxNode::sourceRange
                           (&((pDVar12->initializer->expr).ptr)->super_SyntaxNode);
        Diagnostic::operator<<(pDVar13,SVar20);
      }
      uVar15 = __begin3.index + 1;
      __begin3.index = uVar15;
      uVar19 = uVar19 + 1;
      pPVar17 = __begin3.list;
    }
    ppSVar16 = ppSVar16 + 1;
  } while( true );
}

Assistant:

const Type& PackedUnionType::fromSyntax(Compilation& comp, const StructUnionTypeSyntax& syntax,
                                        const ASTContext& parentContext) {
    const bool isSigned = syntax.signing.kind == TokenKind::SignedKeyword;
    const bool isTagged = syntax.taggedOrSoft.kind == TokenKind::TaggedKeyword;
    const bool isSoft = syntax.taggedOrSoft.kind == TokenKind::SoftKeyword;
    bool issuedError = false;
    uint32_t fieldIndex = 0;

    auto unionType = comp.emplace<PackedUnionType>(comp, isSigned, isTagged, isSoft,
                                                   syntax.keyword.location(), parentContext);
    unionType->setSyntax(syntax);

    ASTContext context(*unionType, LookupLocation::max, parentContext.flags);

    for (auto member : syntax.members) {
        if (member->previewNode)
            unionType->addMembers(*member->previewNode);

        const Type& type = comp.getType(*member->type, context);
        unionType->isFourState |= type.isFourState();
        issuedError |= type.isError();

        if (!issuedError && !type.isIntegral() && (!isTagged || !type.isVoid())) {
            issuedError = true;
            auto& diag = context.addDiag(diag::PackedMemberNotIntegral,
                                         member->type->getFirstToken().location());
            diag << type;
            diag << member->type->sourceRange();
        }

        for (auto decl : member->declarators) {
            auto name = decl->name;
            auto field = comp.emplace<FieldSymbol>(name.valueText(), name.location(), 0u,
                                                   fieldIndex++);
            field->setType(type);
            field->setSyntax(*decl);
            field->setAttributes(*context.scope, member->attributes);
            unionType->addMember(*field);

            // Unpacked arrays are disallowed in packed unions.
            if (const Type& dimType = comp.getType(type, decl->dimensions, context);
                dimType.isUnpackedArray() && !issuedError) {

                auto& diag = context.addDiag(diag::PackedMemberNotIntegral, decl->name.range());
                diag << dimType;
                diag << decl->dimensions.sourceRange();
                issuedError = true;
            }

            if (!unionType->bitWidth) {
                unionType->bitWidth = type.getBitWidth();
            }
            else if (isTagged || isSoft) {
                // In tagged unions the members don't all have to have the same width.
                unionType->bitWidth = std::max(unionType->bitWidth, type.getBitWidth());
            }
            else if (unionType->bitWidth != type.getBitWidth() && !issuedError &&
                     !name.valueText().empty()) {
                auto& diag = context.addDiag(diag::PackedUnionWidthMismatch, name.range());
                diag << name.valueText() << type.getBitWidth() << unionType->bitWidth;
                issuedError = true;
            }

            if (decl->initializer) {
                auto& diag = context.addDiag(diag::PackedMemberHasInitializer,
                                             decl->initializer->equals.location());
                diag << decl->initializer->expr->sourceRange();
            }
        }
    }

    // In tagged unions the tag contributes to the total number of packed bits.
    if (isTagged && fieldIndex) {
        unionType->tagBits = (uint32_t)std::bit_width(fieldIndex - 1);
        unionType->bitWidth += unionType->tagBits;
    }

    if (!unionType->bitWidth || issuedError)
        return comp.getErrorType();

    return createPackedDims(context, unionType, syntax.dimensions);
}